

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_csvmodelserialiser.cpp
# Opt level: O0

void __thiscall tst_CsvModelSerialiser::basicSaveLoadByteArrayNoHeader(tst_CsvModelSerialiser *this)

{
  QAbstractItemModel *sourceModel_00;
  QAbstractItemModel *destinationModel_00;
  int iVar1;
  undefined8 *puVar2;
  CsvModelSerialiser local_38 [8];
  CsvModelSerialiser serialiser;
  QAbstractItemModel *destinationModel;
  QAbstractItemModel *sourceModel;
  tst_CsvModelSerialiser *this_local;
  
  iVar1 = qMetaTypeId<QAbstractItemModel_const*>();
  puVar2 = (undefined8 *)QTest::qData("sourceModel",iVar1);
  sourceModel_00 = (QAbstractItemModel *)*puVar2;
  iVar1 = qMetaTypeId<QAbstractItemModel*>();
  puVar2 = (undefined8 *)QTest::qData("destinationModel",iVar1);
  destinationModel_00 = (QAbstractItemModel *)*puVar2;
  CsvModelSerialiser::CsvModelSerialiser(local_38,(QObject *)0x0);
  CsvModelSerialiser::setFirstColumnIsHeader(SUB81(local_38,0));
  CsvModelSerialiser::setFirstRowIsHeader(SUB81(local_38,0));
  tst_SerialiserCommon::saveLoadByteArray
            (&this->super_tst_SerialiserCommon,(AbstractModelSerialiser *)local_38,sourceModel_00,
             destinationModel_00,false,false);
  QObject::deleteLater();
  CsvModelSerialiser::~CsvModelSerialiser(local_38);
  return;
}

Assistant:

void tst_CsvModelSerialiser::basicSaveLoadByteArrayNoHeader()
{
    QFETCH(const QAbstractItemModel *, sourceModel);
    QFETCH(QAbstractItemModel *, destinationModel);
    CsvModelSerialiser serialiser;
    serialiser.setFirstColumnIsHeader(false);
    serialiser.setFirstRowIsHeader(false);
    saveLoadByteArray(&serialiser, sourceModel, destinationModel, false, false);
    destinationModel->deleteLater();
}